

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O2

int64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getSmallInt(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  unsigned_long uVar2;
  int64_t iVar3;
  Exception *pEVar4;
  uint uVar5;
  long lVar6;
  
  bVar1 = **(byte **)this;
  if ((byte)(bVar1 - 0x30) < 10) {
    return (ulong)(bVar1 & 0xf);
  }
  if ((byte)(bVar1 - 0x3a) < 6) {
    return (long)(char)bVar1 | 0xffffffffffffffc0;
  }
  if (((int)(char)bVar1 & 0xf0U | 8) != 0x28) {
    pEVar4 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar4,InvalidValueType,"Expecting type SmallInt");
    __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
  }
  bVar1 = **(byte **)this;
  uVar5 = (uint)bVar1;
  if ((uVar5 & 0xfffffff8) == 0x28) {
    uVar2 = getUIntUnchecked(this);
    if ((long)uVar2 < 0) {
      pEVar4 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(pEVar4,NumberOutOfRange);
      goto LAB_0010c5aa;
    }
  }
  else {
    if ((uVar5 & 0xfffffff8) != 0x20) {
      if ((bVar1 & 0xf0) == 0x30) {
        iVar3 = getSmallIntUnchecked(this);
        return iVar3;
      }
      pEVar4 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(pEVar4,InvalidValueType,"Expecting type Int");
LAB_0010c5aa:
      __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
    }
    uVar2 = readIntegerNonEmpty<unsigned_long>(*(byte **)this + 1,(ulong)(uVar5 - 0x1f));
    if (bVar1 != 0x27) {
      lVar6 = 0;
      if (*(long *)((anonymous_namespace)::maxValues + (ulong)(uVar5 - 0x20) * 8) <= (long)uVar2) {
        lVar6 = *(long *)((anonymous_namespace)::maxValues + (ulong)(uVar5 - 0x20) * 8) * 2;
      }
      uVar2 = uVar2 - lVar6;
    }
  }
  return uVar2;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }